

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O3

base_learner * mwt_setup(options_i *options,vw *all)

{
  bool *pbVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  options_i *options_00;
  int iVar4;
  mwt *dat;
  long lVar5;
  option_group_definition *poVar6;
  policy_data *ppVar7;
  base_learner *pbVar8;
  learner<char,_example> *base;
  learner<MWT::mwt,_example> *plVar9;
  code *predict;
  size_type sVar10;
  code *learn;
  undefined **ppuVar11;
  label_parser *plVar12;
  size_t nmemb;
  byte bVar13;
  bool exclude_eval;
  string s;
  size_type __dnew_3;
  option_group_definition new_options;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew;
  bool local_449;
  vw *local_448;
  _func_int ***local_440;
  _func_int **local_438;
  _func_int **local_430 [2];
  options_i *local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  long local_3f8;
  _func_int ***local_3f0;
  _func_int **local_3e8;
  _func_int **local_3e0 [2];
  option_group_definition local_3d0;
  string local_398;
  string local_378;
  long *local_358;
  long local_350;
  long local_348 [2];
  _func_int ***local_338;
  _func_int **local_330;
  _func_int **local_328 [2];
  string local_318;
  undefined1 local_2f8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  undefined1 local_258 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined1 local_1b8 [112];
  bool local_148;
  ios_base local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  bVar13 = 0;
  local_448 = all;
  dat = calloc_or_throw<MWT::mwt>(1);
  memset(dat,0,0x6980);
  lVar5 = 0x178;
  do {
    pbVar1 = dat->namespaces + lVar5 + 0x50;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = dat->namespaces + lVar5 + 0x40;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = dat->namespaces + lVar5 + 0x30;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = dat->namespaces + lVar5 + 0x20;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = dat->namespaces + lVar5 + 0x10;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = dat->namespaces + lVar5;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = dat->namespaces + lVar5 + 0x60;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    lVar5 = lVar5 + 0x68;
  } while (lVar5 != 27000);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  local_449 = false;
  local_1b8._0_8_ = (_func_int **)0x1a;
  local_440 = local_430;
  local_440 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)local_1b8);
  local_430[0] = (_func_int **)local_1b8._0_8_;
  builtin_strncpy((char *)((long)local_440 + 10)," Testing",8);
  builtin_strncpy((char *)((long)local_440 + 0x12)," Options",8);
  *(undefined4 *)local_440 = 0x746c754d;
  builtin_strncpy((char *)((long)local_440 + 4),"iwor",4);
  *(undefined4 *)(local_440 + 1) = 0x5420646c;
  builtin_strncpy((char *)((long)local_440 + 0xc),"esti",4);
  local_438 = (_func_int **)local_1b8._0_8_;
  *(char *)((long)local_440 + local_1b8._0_8_) = '\0';
  local_3d0.m_name._M_dataplus._M_p = (pointer)&local_3d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,local_440,(char *)(local_1b8._0_8_ + (long)local_440));
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378.field_2._M_allocated_capacity._0_7_ = 0x6f7769746c756d;
  local_378.field_2._M_local_buf[7] = 'r';
  local_378.field_2._8_7_ = 0x747365745f646c;
  local_378._M_string_length = 0xf;
  local_378.field_2._M_local_buf[0xf] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8,&local_378,&local_418);
  local_148 = true;
  local_3f0 = local_3e0;
  local_258._0_8_ = (_func_int **)0x1f;
  local_3f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)local_258);
  local_3e0[0] = (_func_int **)local_258._0_8_;
  builtin_strncpy((char *)((long)local_3f0 + 0xf),"es as a ",8);
  builtin_strncpy((char *)((long)local_3f0 + 0x17),"policies",8);
  *local_3f0 = (_func_int **)0x657461756c617645;
  local_3f0[1] = (_func_int **)0x6572757461656620;
  local_3e8 = (_func_int **)local_258._0_8_;
  *(char *)((long)local_3f0 + local_258._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1b8 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&local_3d0,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1b8);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398.field_2._M_allocated_capacity._0_4_ = 0x7261656c;
  local_398.field_2._M_allocated_capacity._4_2_ = 0x6e;
  local_398._M_string_length = 5;
  local_420 = options;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_258,&local_398,&dat->num_classes);
  local_2f8._0_8_ = (_func_int **)0x2d;
  local_338 = local_328;
  local_338 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_338,(ulong)local_2f8);
  local_328[0] = (_func_int **)local_2f8._0_8_;
  builtin_strncpy((char *)((long)local_338 + 0x1d)," on <n> ",8);
  builtin_strncpy((char *)((long)local_338 + 0x25),"classes.",8);
  local_338[2] = (_func_int **)0x61656c207469646e;
  local_338[3] = (_func_int **)0x6e6f20676e696e72;
  *local_338 = (_func_int **)0x65746e6f43206f44;
  local_338[1] = (_func_int **)0x6142206c61757478;
  local_330 = (_func_int **)local_2f8._0_8_;
  *(char *)((long)local_338 + local_2f8._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_258 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar6,(typed_option<unsigned_int> *)local_258);
  local_318.field_2._M_allocated_capacity = 0x5f6564756c637865;
  local_318.field_2._8_4_ = 0x6c617665;
  local_318._M_string_length = 0xc;
  local_318.field_2._M_local_buf[0xc] = '\0';
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2f8,&local_318,&local_449);
  local_3f8 = 0x2b;
  local_358 = local_348;
  local_358 = (long *)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)&local_3f8);
  local_348[0] = local_3f8;
  builtin_strncpy((char *)((long)local_358 + 0x1b)," before ",8);
  builtin_strncpy((char *)((long)local_358 + 0x23),"learning",8);
  local_358[2] = 0x7574616566207963;
  local_358[3] = 0x6f66656220736572;
  *local_358 = 0x2064726163736944;
  local_358[1] = 0x696c6f702074776d;
  local_350 = local_3f8;
  *(char *)((long)local_358 + local_3f8) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar6,(typed_option<bool> *)local_2f8);
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  local_2f8._0_8_ = &PTR__typed_option_002d60f0;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  options_00 = local_420;
  local_258._0_8_ = &PTR__typed_option_002d6238;
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  local_1b8._0_8_ = &PTR__typed_option_002d6158;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_3d0);
  pp_Var2 = (_func_int **)(local_1b8 + 0x10);
  local_1b8._16_2_ = 0x756d;
  local_1b8[0x12] = 0x6c;
  local_1b8._19_4_ = 0x6f776974;
  local_1b8[0x17] = 0x72;
  local_1b8._24_7_ = 0x747365745f646c;
  local_1b8._8_8_ = (pointer)0xf;
  local_1b8[0x1f] = '\0';
  local_1b8._0_8_ = pp_Var2;
  iVar4 = (*options_00->_vptr_options_i[1])(options_00,local_1b8);
  if ((_func_int **)local_1b8._0_8_ != pp_Var2) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((char)iVar4 == '\0') {
    plVar9 = (learner<MWT::mwt,_example> *)0x0;
  }
  else {
    if (local_418._M_string_length != 0) {
      sVar10 = 0;
      do {
        dat->namespaces[(byte)local_418._M_dataplus._M_p[sVar10]] = true;
        sVar10 = sVar10 + 1;
      } while (local_418._M_string_length != sVar10);
    }
    dat->all = local_448;
    nmemb = 1L << ((byte)local_448->num_bits & 0x3f);
    ppVar7 = calloc_or_throw<MWT::policy_data>(nmemb);
    (dat->evals)._begin = ppVar7;
    (dat->evals)._end = ppVar7;
    (dat->evals).end_array = ppVar7 + nmemb;
    (dat->evals)._end = ppVar7 + (1L << ((byte)local_448->num_bits & 0x3f));
    local_448->delete_prediction = delete_scalars;
    ppuVar11 = &CB::cb_label;
    plVar12 = &local_448->p->lp;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      plVar12->default_label = (_func_void_void_ptr *)*ppuVar11;
      ppuVar11 = ppuVar11 + (ulong)bVar13 * -2 + 1;
      plVar12 = (label_parser *)((long)plVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    local_448->label_type = cb;
    if (dat->num_classes != 0) {
      dat->learn = true;
      local_1b8._16_2_ = 0x6263;
      local_1b8._8_8_ = (pointer)0x2;
      local_1b8[0x12] = 0;
      local_1b8._0_8_ = pp_Var2;
      iVar4 = (*options_00->_vptr_options_i[1])(options_00);
      if ((_func_int **)local_1b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if ((char)iVar4 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        local_258._16_2_ = 0x6263;
        local_258._8_8_ = (pointer)0x2;
        local_258[0x12] = 0;
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::stringbuf::str();
        (*options_00->_vptr_options_i[5])(options_00,local_258,local_2f8);
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_);
        }
        if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
          operator_delete((void *)local_258._0_8_);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
    }
    if (dat->learn == true) {
      if (local_449 == true) {
        pbVar8 = setup_base(options_00,local_448);
        base = LEARNER::as_singleline<char,char>(pbVar8);
        predict = MWT::predict_or_learn<true,true,false>;
        learn = MWT::predict_or_learn<true,true,true>;
      }
      else {
        pbVar8 = setup_base(options_00,local_448);
        base = LEARNER::as_singleline<char,char>(pbVar8);
        predict = MWT::predict_or_learn<true,false,false>;
        learn = MWT::predict_or_learn<true,false,true>;
      }
    }
    else {
      pbVar8 = setup_base(options_00,local_448);
      base = LEARNER::as_singleline<char,char>(pbVar8);
      predict = MWT::predict_or_learn<false,false,false>;
      learn = MWT::predict_or_learn<false,false,true>;
    }
    plVar9 = LEARNER::learner<MWT::mwt,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,learn,predict,1,scalars);
    *(code **)(plVar9 + 0x80) = MWT::save_load;
    uVar3 = *(undefined8 *)(plVar9 + 0x18);
    *(undefined8 *)(plVar9 + 0x70) = uVar3;
    *(undefined8 *)(plVar9 + 0x78) = *(undefined8 *)(plVar9 + 0x20);
    *(undefined8 *)(plVar9 + 0x58) = uVar3;
    *(code **)(plVar9 + 0x68) = MWT::finish_example;
    *(undefined8 *)(plVar9 + 0xb8) = uVar3;
    *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
    *(code **)(plVar9 + 200) = MWT::finish;
    dat = (mwt *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_3d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != &local_3d0.m_name.field_2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  if (dat != (mwt *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* mwt_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<mwt>();
  string s;
  bool exclude_eval = false;
  option_group_definition new_options("Multiworld Testing Options");
  new_options.add(make_option("multiworld_test", s).keep().help("Evaluate features as a policies"))
      .add(make_option("learn", c->num_classes).help("Do Contextual Bandit learning on <n> classes."))
      .add(make_option("exclude_eval", exclude_eval).help("Discard mwt policy features before learning"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multiworld_test"))
    return nullptr;

  for (size_t i = 0; i < s.size(); i++) c->namespaces[(unsigned char)s[i]] = true;
  c->all = &all;

  calloc_reserve(c->evals, all.length());
  c->evals.end() = c->evals.begin() + all.length();

  all.delete_prediction = delete_scalars;
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  if (c->num_classes > 0)
  {
    c->learn = true;

    if (!options.was_supplied("cb"))
    {
      stringstream ss;
      ss << c->num_classes;
      options.insert("cb", ss.str());
    }
  }

  learner<mwt, example>* l;
  if (c->learn)
    if (exclude_eval)
      l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<true, true, true>,
          predict_or_learn<true, true, false>, 1, prediction_type::scalars);
    else
      l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<true, false, true>,
          predict_or_learn<true, false, false>, 1, prediction_type::scalars);
  else
    l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<false, false, true>,
        predict_or_learn<false, false, false>, 1, prediction_type::scalars);

  l->set_save_load(save_load);
  l->set_finish_example(finish_example);
  l->set_finish(finish);
  return make_base(*l);
}